

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.h
# Opt level: O0

void asmjit::v1_14::Support::Internal::
     bitVectorOp<unsigned_long,asmjit::v1_14::Support::AndNot,asmjit::v1_14::Support::SetNot>
               (unsigned_long *buf,size_t index,size_t count)

{
  ulong local_98;
  size_t firstNBits;
  unsigned_long kFillMask;
  size_t bitIndex;
  size_t vecIndex;
  size_t kTSizeInBits;
  size_t count_local;
  size_t index_local;
  unsigned_long *buf_local;
  
  if (count != 0) {
    bitIndex = (size_t)(buf + (index >> 6));
    local_98 = 0x40 - (index & 0x3f);
    if (count < local_98) {
      local_98 = count;
    }
    *(ulong *)bitIndex =
         *(ulong *)bitIndex &
         ((0xffffffffffffffffU >> (0x40U - (char)local_98 & 0x3f)) << (sbyte)(index & 0x3f) ^
         0xffffffffffffffff);
    for (firstNBits = count - local_98; bitIndex = bitIndex + 8, 0x3f < firstNBits;
        firstNBits = firstNBits - 0x40) {
      *(undefined8 *)bitIndex = 0;
    }
    if (firstNBits != 0) {
      *(ulong *)bitIndex =
           *(ulong *)bitIndex &
           (0xffffffffffffffffU >> (0x40U - (char)firstNBits & 0x3f) ^ 0xffffffffffffffff);
    }
  }
  return;
}

Assistant:

static ASMJIT_FORCE_INLINE void bitVectorOp(T* buf, size_t index, size_t count) noexcept {
    if (count == 0)
      return;

    const size_t kTSizeInBits = bitSizeOf<T>();
    size_t vecIndex = index / kTSizeInBits; // T[]
    size_t bitIndex = index % kTSizeInBits; // T[][]

    buf += vecIndex;

    // The first BitWord requires special handling to preserve bits outside the fill region.
    const T kFillMask = allOnes<T>();
    size_t firstNBits = min<size_t>(kTSizeInBits - bitIndex, count);

    buf[0] = OperatorT::op(buf[0], (kFillMask >> (kTSizeInBits - firstNBits)) << bitIndex);
    buf++;
    count -= firstNBits;

    // All bits between the first and last affected BitWords can be just filled.
    while (count >= kTSizeInBits) {
      buf[0] = FullWordOpT::op(buf[0], kFillMask);
      buf++;
      count -= kTSizeInBits;
    }

    // The last BitWord requires special handling as well
    if (count)
      buf[0] = OperatorT::op(buf[0], kFillMask >> (kTSizeInBits - count));
  }